

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swift_generator.cc
# Opt level: O1

string * grpc_swift_generator::anon_unknown_0::WrapInNameSpace
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *components,string *name)

{
  pointer pcVar1;
  string *psVar2;
  pointer pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string qualified_name;
  long *local_80 [2];
  long local_70 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string *local_40;
  string *local_38;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  pbVar3 = (components->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_40 = name;
  local_38 = __return_storage_ptr__;
  if (pbVar3 != (components->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pcVar1 = (pbVar3->_M_dataplus)._M_p;
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,pcVar1,pcVar1 + pbVar3->_M_string_length);
      std::__cxx11::string::append((char *)local_80);
      std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_80[0]);
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != (components->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  psVar2 = local_38;
  std::operator+(local_38,&local_60,local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return psVar2;
}

Assistant:

static std::string WrapInNameSpace(const std::vector<std::string> &components,
                            const grpc::string &name) {
  std::string qualified_name;
  for (auto it = components.begin(); it != components.end(); ++it)
    qualified_name += *it + "_";
  return qualified_name + name;
}